

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O0

int Cec_ManCheckNonTrivialCands(Gia_Man_t *pAig)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_28;
  int local_24;
  int RetValue;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *pAig_local;
  
  local_28 = 0;
  if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    pAig_local._4_4_ = 0;
  }
  else {
    local_24 = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(pAig);
      bVar3 = false;
      if (local_24 < iVar1) {
        _RetValue = Gia_ManCo(pAig,local_24);
        bVar3 = _RetValue != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      pGVar2 = Gia_ObjFanin0(_RetValue);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff | 0x40000000;
      local_24 = local_24 + 1;
    }
    local_24 = 0;
    while( true ) {
      bVar3 = false;
      if (local_24 < pAig->nObjs) {
        _RetValue = Gia_ManObj(pAig,local_24);
        bVar3 = _RetValue != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) goto LAB_007fb5e2;
      iVar1 = Gia_ObjIsCand(_RetValue);
      if (((iVar1 != 0) && ((*(ulong *)_RetValue >> 0x1e & 1) == 0)) &&
         (iVar1 = Gia_ObjRepr(pAig,local_24), iVar1 != 0xfffffff)) break;
      local_24 = local_24 + 1;
    }
    local_28 = 1;
LAB_007fb5e2:
    local_24 = 0;
    while( true ) {
      iVar1 = Gia_ManPoNum(pAig);
      bVar3 = false;
      if (local_24 < iVar1) {
        _RetValue = Gia_ManCo(pAig,local_24);
        bVar3 = _RetValue != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      pGVar2 = Gia_ObjFanin0(_RetValue);
      *(ulong *)pGVar2 = *(ulong *)pGVar2 & 0xffffffffbfffffff;
      local_24 = local_24 + 1;
    }
    pAig_local._4_4_ = local_28;
  }
  return pAig_local._4_4_;
}

Assistant:

int Cec_ManCheckNonTrivialCands( Gia_Man_t * pAig )
{
    Gia_Obj_t * pObj;
    int i, RetValue = 0;
    if ( pAig->pReprs == NULL )
        return 0;
    // label internal nodes driving POs
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 1;
    // check if there are non-labled equivs
    Gia_ManForEachObj( pAig, pObj, i )
        if ( Gia_ObjIsCand(pObj) && !pObj->fMark0 && Gia_ObjRepr(pAig, i) != GIA_VOID )
        {
            RetValue = 1;
            break;
        }
    // clean internal nodes driving POs
    Gia_ManForEachPo( pAig, pObj, i )
        Gia_ObjFanin0(pObj)->fMark0 = 0;
    return RetValue;
}